

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint8_t *puVar1;
  pointer ptVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  result_type rVar6;
  ulong uVar7;
  size_t __i;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uniform_int_distribution<int> dis;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  sigaction act;
  mt19937 gen;
  random_device rd;
  int local_2824;
  uint local_2820;
  int local_281c;
  int local_2818;
  int local_2814;
  uniform_int_distribution<int> local_2810;
  vector<std::thread,_std::allocator<std::thread>_> local_2808;
  size_type local_27e8;
  long local_27e0;
  sigaction local_27d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  if (argc < 3) {
    __assert_fail("argc >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/mprotect_mt/main.cpp"
                  ,0x75,"int main(int, char **)");
  }
  memset(&local_27d8,0,0x98);
  sigemptyset(&local_27d8.sa_mask);
  local_27d8.__sigaction_handler.sa_handler = segv_handler;
  local_27d8.sa_flags = 4;
  sigaction(0xb,&local_27d8,(sigaction *)0x0);
  uVar4 = atoi(argv[1]);
  local_2818 = atoi(argv[2]);
  if (0 < local_2818) {
    local_27e8 = (size_type)(int)uVar4;
    uVar9 = (ulong)uVar4;
    local_281c = uVar4 - 1;
    local_27e0 = uVar9 * 8;
    local_2814 = 0;
    local_2820 = uVar4;
    do {
      uVar4 = local_2820;
      thread_done = false;
      std::vector<thread_data_t,_std::allocator<thread_data_t>_>::resize(&thread_datas,local_27e8);
      std::random_device::random_device(&local_13b8);
      uVar5 = std::random_device::_M_getval();
      local_2740._M_x[0] = (unsigned_long)uVar5;
      lVar8 = 1;
      uVar7 = local_2740._M_x[0];
      do {
        uVar7 = (ulong)(((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar8);
        local_2740._M_x[lVar8] = uVar7;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x270);
      local_2740._M_p = 0x270;
      local_2810._M_param._M_a = 0;
      local_2810._M_param._M_b = local_281c;
      if ((int)uVar4 < 1) {
        page = (uint32_t *)mmap((void *)0x0,0x1000,1,0x22,-1,0);
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2824 = 0;
      }
      else {
        lVar8 = 0;
        do {
          ptVar2 = thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar1 = (thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                    _M_impl.super__Vector_impl_data._M_start)->padding + lVar8 + 0x80;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (&ptVar2->triggered)[lVar8] = false;
          rVar6 = std::uniform_int_distribution<int>::operator()
                            (&local_2810,&local_2740,&local_2810._M_param);
          *(result_type *)((long)&ptVar2->other_id + lVar8) = rVar6;
          lVar8 = lVar8 + 0x98;
        } while (uVar9 * 0x98 - lVar8 != 0);
        page = (uint32_t *)mmap((void *)0x0,0x1000,1,0x22,-1,0);
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2824 = 0;
        if (0 < (int)uVar4) {
          do {
            std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)(int),int&>
                      ((vector<std::thread,std::allocator<std::thread>> *)&local_2808,
                       run_thread_loop,&local_2824);
            local_2824 = local_2824 + 1;
          } while (local_2824 < (int)uVar4);
        }
      }
      usleep(100);
      mprotect(page,0x1000,0);
      if ((int)uVar4 < 1) {
        mprotect(page,0x1000,3);
        *page = 1;
LAB_001026cd:
        thread_done = true;
        uVar4 = 0;
      }
      else {
        uVar7 = 0;
        do {
          if ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7].triggered & 1U) == 0) {
            do {
            } while ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].triggered & 1U) == 0);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar9);
        mprotect(page,0x1000,3);
        *page = 1;
        thread_done = true;
        if ((int)uVar4 < 1) goto LAB_001026cd;
        lVar10 = 0;
        lVar8 = 0x12;
        uVar4 = 0;
        do {
          if ((*(uintptr_t *)
                ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                  _M_impl.super__Vector_impl_data._M_start)->padding + lVar8 * 8 + -8) !=
               thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
               _M_impl.super__Vector_impl_data._M_start
               [*(int *)((thread_datas.
                          super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl.
                          super__Vector_impl_data._M_start)->padding + lVar8 * 8)].self_count) &&
             (*(uintptr_t *)
               ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                 _M_impl.super__Vector_impl_data._M_start)->padding + lVar8 * 8 + -8) + 1 !=
              thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl
              .super__Vector_impl_data._M_start
              [*(int *)((thread_datas.
                         super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl.
                         super__Vector_impl_data._M_start)->padding + lVar8 * 8)].self_count)) {
            uVar4 = uVar4 + 1;
            printf("%d, %zu, %zu\n");
          }
          std::thread::join();
          lVar10 = lVar10 + 8;
          lVar8 = lVar8 + 0x13;
        } while (local_27e0 != lVar10);
      }
      munmap(page,0x1000);
      page = (uint32_t *)0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_2808);
      std::random_device::_M_fini();
      iVar3 = local_2814;
      if (uVar4 != 0) {
        printf("%d\n",(ulong)uVar4);
      }
      local_2814 = iVar3 + 1;
    } while (local_2814 != local_2818);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    assert(argc >= 3);
    struct sigaction act;
    memset(&act, 0, sizeof(struct sigaction));
    sigemptyset(&act.sa_mask);
    act.sa_sigaction = segv_handler;
    act.sa_flags = SA_SIGINFO;
    sigaction(SIGSEGV, &act, NULL);
    int nt = atoi(argv[1]);
    int n = atoi(argv[2]);
    for (int i = 0;i < n;i++) {
        if (int violation = run_n_threads(nt)) {
            printf("%d\n", violation);
        }
    }
    return 0;
}